

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  size_type sVar1;
  iterator piVar2;
  size_t sVar3;
  iterator piVar4;
  const_iterator piVar5;
  const_iterator Dest;
  SmallVectorTemplateCommon<int,_void> *in_RSI;
  SmallVectorTemplateCommon<int,_void> *in_RDI;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  size_t in_stack_ffffffffffffff88;
  SmallVectorTemplateCommon<int,_void> *in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  const_iterator in_stack_ffffffffffffffa0;
  int *local_30;
  size_type local_28;
  
  if (in_RDI != in_RSI) {
    sVar1 = SmallVectorTemplateCommon<int,_void>::size(in_stack_ffffffffffffff90);
    local_28 = SmallVectorTemplateCommon<int,_void>::size(in_stack_ffffffffffffff90);
    if (local_28 < sVar1) {
      sVar3 = SmallVectorTemplateCommon<int,_void>::capacity(in_stack_ffffffffffffff90);
      if (sVar3 < sVar1) {
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        piVar4 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
        SmallVectorTemplateBase<int,_true>::destroy_range(piVar2,piVar4);
        piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,piVar2);
        local_28 = 0;
        SmallVectorTemplateBase<int,_true>::grow
                  ((SmallVectorTemplateBase<int,_true> *)in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
      }
      else if (local_28 != 0) {
        in_stack_ffffffffffffff98 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
        in_stack_ffffffffffffffa0 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + local_28;
        SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        std::copy<int_const*,int*>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (int *)in_stack_ffffffffffffff90);
      }
      piVar5 = SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
      piVar5 = piVar5 + local_28;
      Dest = SmallVectorTemplateCommon<int,_void>::end(in_RSI);
      SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
      SmallVectorTemplateBase<int,true>::uninitialized_copy<int_const,int>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,Dest,piVar5);
      piVar2 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
      SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,piVar2 + sVar1);
    }
    else {
      if (sVar1 == 0) {
        local_30 = SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
      }
      else {
        SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
        SmallVectorTemplateCommon<int,_void>::begin(in_RSI);
        SmallVectorTemplateCommon<int,_void>::begin(in_RDI);
        local_30 = std::copy<int_const*,int*>
                             (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              (int *)in_stack_ffffffffffffff90);
      }
      piVar2 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
      SmallVectorTemplateBase<int,_true>::destroy_range(local_30,piVar2);
      SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,local_30);
    }
  }
  return (SmallVectorImpl<int> *)in_RDI;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}